

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputeProperty.cpp
# Opt level: O0

float Rml::ComputeLength(NumericValue value,float font_size,float document_font_size,float dp_ratio,
                        Vector2f vp_dimensions)

{
  code *pcVar1;
  bool bVar2;
  Units units;
  float dp_ratio_local;
  float document_font_size_local;
  float font_size_local;
  Vector2f vp_dimensions_local;
  NumericValue value_local;
  
  vp_dimensions_local.y = (float)value.unit;
  units = operator&((Units)vp_dimensions_local.y,PPI_UNIT);
  bVar2 = Any(units);
  if (bVar2) {
    value_local.number = ComputePPILength(value,dp_ratio);
  }
  else {
    vp_dimensions_local.x = value.number;
    if (vp_dimensions_local.y == 8.96831e-44) {
      value_local.number = vp_dimensions_local.x;
    }
    else if (vp_dimensions_local.y == 1.79366e-43) {
      value_local.number = vp_dimensions_local.x * dp_ratio;
    }
    else if (vp_dimensions_local.y == 3.58732e-43) {
      document_font_size_local = vp_dimensions.x;
      value_local.number = vp_dimensions_local.x * document_font_size_local * 0.01;
    }
    else if (vp_dimensions_local.y == 7.17465e-43) {
      font_size_local = vp_dimensions.y;
      value_local.number = vp_dimensions_local.x * font_size_local * 0.01;
    }
    else if (vp_dimensions_local.y == 2.86986e-42) {
      value_local.number = vp_dimensions_local.x * font_size;
    }
    else if (vp_dimensions_local.y == 5.73972e-42) {
      value_local.number = vp_dimensions_local.x * document_font_size;
    }
    else {
      bVar2 = Assert("RMLUI_ERROR",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ComputeProperty.cpp"
                     ,0x60);
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      value_local.number = 0.0;
    }
  }
  return value_local.number;
}

Assistant:

float ComputeLength(NumericValue value, float font_size, float document_font_size, float dp_ratio, Vector2f vp_dimensions)
{
	if (Any(value.unit & Unit::PPI_UNIT))
		return ComputePPILength(value, dp_ratio);

	switch (value.unit)
	{
	case Unit::PX: return value.number;
	case Unit::EM: return value.number * font_size;
	case Unit::REM: return value.number * document_font_size;
	case Unit::DP: return value.number * dp_ratio;
	case Unit::VW: return value.number * vp_dimensions.x * 0.01f;
	case Unit::VH: return value.number * vp_dimensions.y * 0.01f;
	default: break;
	}

	RMLUI_ERROR;
	return 0.0f;
}